

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O0

void __thiscall layer::Convolution2D::predict(Convolution2D *this)

{
  longdouble *plVar1;
  undefined1 auVar2 [16];
  Convolution2D *pCVar3;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar4;
  undefined6 in_stack_ffffffffffffffc2;
  int local_30;
  int local_2c;
  int posXKernel;
  int posYKernel;
  int posZKernel;
  int posXOut;
  int posYOut;
  int posZOut;
  int posYIn;
  int posXIn;
  Convolution2D *this_local;
  
  pCVar3 = this;
  for (posXOut = 0; posXOut < (this->super_Layer)._sizeZOut; posXOut = posXOut + 1) {
    for (posZKernel = 0; posZKernel < (this->super_Layer)._sizeYOut; posZKernel = posZKernel + 1) {
      for (posYKernel = 0; posYKernel < (this->super_Layer)._sizeXOut; posYKernel = posYKernel + 1)
      {
        (this->super_Layer)._out[posXOut][posZKernel][posYKernel] = (longdouble)0;
        for (posXKernel = 0; posXKernel < (this->super_Layer)._sizeZWeight;
            posXKernel = posXKernel + 1) {
          posYOut = posZKernel * this->_stepY - this->_zeroPaddingY;
          for (local_2c = 0; local_2c < (this->super_Layer)._sizeYWeight; local_2c = local_2c + 1) {
            if (-1 < posYOut && posYOut < this->_sizeYIn) {
              posZOut = posYKernel * this->_stepX - this->_zeroPaddingX;
              for (local_30 = 0; local_30 < (this->super_Layer)._sizeXWeight;
                  local_30 = local_30 + 1) {
                if (-1 < posZOut && posZOut < this->_sizeYIn) {
                  pCVar3 = (Convolution2D *)((long)local_30 * 0x10);
                  plVar1 = (this->super_Layer)._out[posXOut][posZKernel];
                  plVar1[posYKernel] =
                       (this->super_Layer)._ptrWeight[posXOut][posXKernel][local_2c][local_30] *
                       (this->super_Layer)._in[posXKernel][posYOut][posZOut] + plVar1[posYKernel];
                  in_ST5 = in_ST4;
                  in_ST6 = in_ST4;
                }
                posZOut = posZOut + 1;
              }
            }
            posYOut = posYOut + 1;
          }
        }
        auVar2._10_6_ = in_stack_ffffffffffffffc2;
        auVar2._0_10_ = (this->super_Layer)._out[posXOut][posZKernel][posYKernel];
        lVar4 = in_ST6;
        (*(this->super_Layer)._fActivation)((scalar *)pCVar3,(scalar)auVar2);
        (this->super_Layer)._out[posXOut][posZKernel][posYKernel] = in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar4;
      }
    }
  }
  return;
}

Assistant:

void Convolution2D::predict()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }